

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  BYTE *s_1;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  ushort *puVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  BYTE *d_1;
  char *pcVar15;
  char *pcVar16;
  BYTE *s;
  ushort *__src;
  BYTE *d;
  char *pcVar17;
  char *pcVar18;
  ulong __n;
  int local_88;
  long local_78 [9];
  
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  if (maxOutputSize == 0) {
    if (compressedSize == 1) {
      local_88 = -(uint)(*source != '\0');
    }
    else {
      local_88 = -1;
    }
  }
  else {
    puVar11 = (ushort *)(source + compressedSize);
    pcVar16 = dest + maxOutputSize;
    pcVar1 = pcVar16 + -8;
    __src = (ushort *)source;
    pcVar17 = dest;
LAB_0013b416:
    uVar5 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar7 = (uint)(byte)((byte)uVar5 >> 4);
    sVar8 = (size_t)uVar7;
    if (uVar7 == 0xf) {
      sVar8 = 0xf;
      do {
        uVar6 = *__src;
        __src = (ushort *)((long)__src + 1);
        sVar8 = sVar8 + (byte)uVar6;
        if ((ushort *)((long)puVar11 - 0xfU) <= __src) break;
      } while ((byte)uVar6 == 0xff);
      if ((long)sVar8 < 0) goto LAB_0013b67f;
    }
    pcVar15 = pcVar17 + sVar8;
    puVar2 = (ushort *)((long)__src + sVar8);
    if ((pcVar15 <= dest + (long)maxOutputSize + -0xc) && (puVar2 <= puVar11 + -4)) {
      do {
        *(undefined8 *)pcVar17 = *(undefined8 *)__src;
        pcVar17 = pcVar17 + 8;
        __src = __src + 4;
      } while (pcVar17 < pcVar15);
      pcVar9 = pcVar15 + -(ulong)*puVar2;
      __src = puVar2 + 1;
      if (((uint)dictSize < 0x10000) && (pcVar9 < dest + -(long)dictSize)) goto LAB_0013b67f;
      uVar12 = (ulong)((byte)uVar5 & 0xf);
      if (uVar12 == 0xf) {
        uVar12 = 0xf;
        do {
          if ((ushort *)((long)puVar11 - 5U) < __src) goto LAB_0013b67f;
          uVar5 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar12 = uVar12 + (byte)uVar5;
        } while ((ulong)(byte)uVar5 == 0xff);
        if ((long)uVar12 < 0) goto LAB_0013b67f;
      }
      pcVar18 = pcVar15 + uVar12 + 4;
      pcVar17 = pcVar18;
      if (pcVar9 < dest) {
        if (pcVar16 + -5 < pcVar18) goto LAB_0013b67f;
        sVar8 = uVar12 + 4;
        uVar12 = (long)dest - (long)pcVar9;
        __n = sVar8 - uVar12;
        if (sVar8 < uVar12 || __n == 0) {
          memmove(pcVar15,dictStart + ((long)dictSize - uVar12),sVar8);
        }
        else {
          memcpy(pcVar15,dictStart + ((long)dictSize - uVar12),uVar12);
          pcVar17 = pcVar15 + uVar12;
          pcVar15 = dest;
          if ((ulong)((long)pcVar17 - (long)dest) < __n) {
            for (; pcVar17 < pcVar18; pcVar17 = pcVar17 + 1) {
              *pcVar17 = *pcVar15;
              pcVar15 = pcVar15 + 1;
            }
          }
          else {
            memcpy(pcVar17,dest,__n);
            pcVar17 = pcVar18;
          }
        }
      }
      else {
        lVar13 = (long)pcVar15 - (long)pcVar9;
        if (lVar13 < 8) {
          lVar4 = *(long *)(&DAT_00149010 + lVar13 * 8);
          pcVar10 = pcVar9 + (lVar4 - local_78[lVar13]);
          *pcVar15 = *pcVar9;
          pcVar15[1] = pcVar9[1];
          pcVar15[2] = pcVar9[2];
          pcVar15[3] = pcVar9[3];
          *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar9 + lVar4);
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar9;
          pcVar10 = pcVar9 + 8;
        }
        pcVar15 = pcVar15 + 8;
        if (dest + (long)maxOutputSize + -0xc < pcVar18) {
          if (pcVar16 + -5 < pcVar18) goto LAB_0013b67f;
          pcVar9 = pcVar10;
          pcVar14 = pcVar15;
          if (pcVar15 < pcVar1) {
            do {
              *(undefined8 *)pcVar14 = *(undefined8 *)pcVar9;
              pcVar14 = pcVar14 + 8;
              pcVar9 = pcVar9 + 8;
            } while (pcVar14 < pcVar1);
            pcVar10 = pcVar10 + ((long)pcVar1 - (long)pcVar15);
            pcVar15 = pcVar1;
          }
          for (; pcVar15 < pcVar18; pcVar15 = pcVar15 + 1) {
            cVar3 = *pcVar10;
            pcVar10 = pcVar10 + 1;
            *pcVar15 = cVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar10;
            pcVar15 = pcVar15 + 8;
            pcVar10 = pcVar10 + 8;
          } while (pcVar15 < pcVar18);
        }
      }
      goto LAB_0013b416;
    }
    if ((puVar2 == puVar11) && (pcVar15 <= pcVar16)) {
      memcpy(pcVar17,__src,sVar8);
      return (int)pcVar15 - (int)dest;
    }
LAB_0013b67f:
    local_88 = (int)source;
    local_88 = ~(uint)__src + local_88;
  }
  return local_88;
}

Assistant:

FORCE_INLINE int LZ4_decompress_generic(
                 const char* const source,
                 char* const dest,
                 int inputSize,
                 int outputSize,         /* If endOnInput==endOnInputSize, this value is the max size of Output Buffer. */

                 int endOnInput,         /* endOnOutputSize, endOnInputSize */
                 int partialDecoding,    /* full, partial */
                 int targetOutputSize,   /* only used if partialDecoding==partial */
                 int dict,               /* noDict, withPrefix64k, usingExtDict */
                 const BYTE* const lowPrefix,  /* == dest if dict == noDict */
                 const BYTE* const dictStart,  /* only if dict==usingExtDict */
                 const size_t dictSize         /* note : = 0 if noDict */
                 )
{
    /* Local Variables */
    const BYTE* ip = (const BYTE*) source;
    const BYTE* const iend = ip + inputSize;

    BYTE* op = (BYTE*) dest;
    BYTE* const oend = op + outputSize;
    BYTE* cpy;
    BYTE* oexit = op + targetOutputSize;
    const BYTE* const lowLimit = lowPrefix - dictSize;

    const BYTE* const dictEnd = (const BYTE*)dictStart + dictSize;
    const size_t dec32table[] = {4, 1, 2, 1, 4, 4, 4, 4};
    const size_t dec64table[] = {0, 0, 0, (size_t)-1, 0, 1, 2, 3};

    const int safeDecode = (endOnInput==endOnInputSize);
    const int checkOffset = ((safeDecode) && (dictSize < (int)(64 KB)));


    /* Special cases */
    if ((partialDecoding) && (oexit> oend-MFLIMIT)) oexit = oend-MFLIMIT;                         /* targetOutputSize too high => decode everything */
    if ((endOnInput) && (unlikely(outputSize==0))) return ((inputSize==1) && (*ip==0)) ? 0 : -1;  /* Empty output buffer */
    if ((!endOnInput) && (unlikely(outputSize==0))) return (*ip==0?1:-1);


    /* Main Loop */
    while (1)
    {
        unsigned token;
        size_t length;
        const BYTE* match;

        /* get literal length */
        token = *ip++;
        if ((length=(token>>ML_BITS)) == RUN_MASK)
        {
            unsigned s;
            do
            {
                s = *ip++;
                length += s;
            }
            while (likely((endOnInput)?ip<iend-RUN_MASK:1) && (s==255));
            if ((safeDecode) && unlikely((size_t)(op+length)<(size_t)(op))) goto _output_error;   /* overflow detection */
            if ((safeDecode) && unlikely((size_t)(ip+length)<(size_t)(ip))) goto _output_error;   /* overflow detection */
        }

        /* copy literals */
        cpy = op+length;
        if (((endOnInput) && ((cpy>(partialDecoding?oexit:oend-MFLIMIT)) || (ip+length>iend-(2+1+LASTLITERALS))) )
            || ((!endOnInput) && (cpy>oend-COPYLENGTH)))
        {
            if (partialDecoding)
            {
                if (cpy > oend) goto _output_error;                           /* Error : write attempt beyond end of output buffer */
                if ((endOnInput) && (ip+length > iend)) goto _output_error;   /* Error : read attempt beyond end of input buffer */
            }
            else
            {
                if ((!endOnInput) && (cpy != oend)) goto _output_error;       /* Error : block decoding must stop exactly there */
                if ((endOnInput) && ((ip+length != iend) || (cpy > oend))) goto _output_error;   /* Error : input must be consumed */
            }
            memcpy(op, ip, length);
            ip += length;
            op += length;
            break;     /* Necessarily EOF, due to parsing restrictions */
        }
        LZ4_wildCopy(op, ip, cpy);
        ip += length; op = cpy;

        /* get offset */
        match = cpy - LZ4_readLE16(ip); ip+=2;
        if ((checkOffset) && (unlikely(match < lowLimit))) goto _output_error;   /* Error : offset outside destination buffer */

        /* get matchlength */
        length = token & ML_MASK;
        if (length == ML_MASK)
        {
            unsigned s;
            do
            {
                if ((endOnInput) && (ip > iend-LASTLITERALS)) goto _output_error;
                s = *ip++;
                length += s;
            } while (s==255);
            if ((safeDecode) && unlikely((size_t)(op+length)<(size_t)op)) goto _output_error;   /* overflow detection */
        }
        length += MINMATCH;

        /* check external dictionary */
        if ((dict==usingExtDict) && (match < lowPrefix))
        {
            if (unlikely(op+length > oend-LASTLITERALS)) goto _output_error;   /* doesn't respect parsing restriction */

            if (length <= (size_t)(lowPrefix-match))
            {
                /* match can be copied as a single segment from external dictionary */
                match = dictEnd - (lowPrefix-match);
                memmove(op, match, length); op += length;
            }
            else
            {
                /* match encompass external dictionary and current segment */
                size_t copySize = (size_t)(lowPrefix-match);
                memcpy(op, dictEnd - copySize, copySize);
                op += copySize;
                copySize = length - copySize;
                if (copySize > (size_t)(op-lowPrefix))   /* overlap within current segment */
                {
                    BYTE* const endOfMatch = op + copySize;
                    const BYTE* copyFrom = lowPrefix;
                    while (op < endOfMatch) *op++ = *copyFrom++;
                }
                else
                {
                    memcpy(op, lowPrefix, copySize);
                    op += copySize;
                }
            }
            continue;
        }

        /* copy repeated sequence */
        cpy = op + length;
        if (unlikely((op-match)<8))
        {
            const size_t dec64 = dec64table[op-match];
            op[0] = match[0];
            op[1] = match[1];
            op[2] = match[2];
            op[3] = match[3];
            match += dec32table[op-match];
            LZ4_copy4(op+4, match);
            op += 8; match -= dec64;
        } else { LZ4_copy8(op, match); op+=8; match+=8; }

        if (unlikely(cpy>oend-12))
        {
            if (cpy > oend-LASTLITERALS) goto _output_error;    /* Error : last LASTLITERALS bytes must be literals */
            if (op < oend-8)
            {
                LZ4_wildCopy(op, match, oend-8);
                match += (oend-8) - op;
                op = oend-8;
            }
            while (op<cpy) *op++ = *match++;
        }
        else
            LZ4_wildCopy(op, match, cpy);
        op=cpy;   /* correction */
    }

    /* end of decoding */
    if (endOnInput)
       return (int) (((char*)op)-dest);     /* Nb of output bytes decoded */
    else
       return (int) (((const char*)ip)-source);   /* Nb of input bytes read */

    /* Overflow error detected */
_output_error:
    return (int) (-(((const char*)ip)-source))-1;
}